

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void ats1h_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  _Bool _Var1;
  uint64_t uVar2;
  uint64_t par64;
  MMUAccessType access_type;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  uVar2 = do_ats_write(env,value,(uint)((ri->opc2 & 1) != 0),ARMMMUIdx_E2);
  _Var1 = arm_is_secure(env);
  if ((!_Var1) || (_Var1 = arm_el_is_aa64(env,3), _Var1)) {
    (env->cp15).field_26.field_0.par_ns = uVar2;
  }
  else {
    (env->cp15).field_26.field_0.par_s = uVar2;
  }
  return;
}

Assistant:

static void ats1h_write(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    MMUAccessType access_type = ri->opc2 & 1 ? MMU_DATA_STORE : MMU_DATA_LOAD;
    uint64_t par64;

    par64 = do_ats_write(env, value, access_type, ARMMMUIdx_E2);

    A32_BANKED_CURRENT_REG_SET(env, par, par64);
}